

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O0

t_symbol * dogensym(char *s,t_symbol *oldsym,_pdinstance *pdinstance)

{
  t_symbol *ptVar1;
  int iVar2;
  char *__dest;
  char *local_50;
  char *s2;
  int length;
  uint hash;
  t_symbol *sym2;
  t_symbol **symhashloc;
  char *symname;
  _pdinstance *pdinstance_local;
  t_symbol *oldsym_local;
  char *s_local;
  
  s2._4_4_ = 0x1505;
  s2._0_4_ = 0;
  for (local_50 = s; *local_50 != '\0'; local_50 = local_50 + 1) {
    s2._4_4_ = s2._4_4_ * 0x21 + (int)*local_50;
    s2._0_4_ = (int)s2 + 1;
  }
  sym2 = (t_symbol *)(pdinstance->pd_symhash + (s2._4_4_ & 0x3fff));
  while( true ) {
    ptVar1 = (t_symbol *)sym2->s_name;
    if (ptVar1 == (t_symbol *)0x0) {
      _length = oldsym;
      if (oldsym == (t_symbol *)0x0) {
        _length = (t_symbol *)getbytes(0x18);
      }
      __dest = (char *)getbytes((long)((int)s2 + 1));
      _length->s_next = (_symbol *)0x0;
      _length->s_thing = (_class **)0x0;
      strcpy(__dest,s);
      _length->s_name = __dest;
      sym2->s_name = (char *)_length;
      return _length;
    }
    iVar2 = strcmp(ptVar1->s_name,s);
    if (iVar2 == 0) break;
    sym2 = (t_symbol *)&ptVar1->s_next;
  }
  return ptVar1;
}

Assistant:

static t_symbol *dogensym(const char *s, t_symbol *oldsym,
    t_pdinstance *pdinstance)
{
    char *symname = 0;
    t_symbol **symhashloc, *sym2;
    unsigned int hash = 5381;
    int length = 0;
    const char *s2 = s;
    while (*s2) /* djb2 hash algo */
    {
        hash = ((hash << 5) + hash) + *s2;
        length++;
        s2++;
    }
    symhashloc = pdinstance->pd_symhash + (hash & (SYMTABHASHSIZE-1));
    while ((sym2 = *symhashloc))
    {
        if (!strcmp(sym2->s_name, s))
            return(sym2);
        symhashloc = &sym2->s_next;
    }
    if (oldsym)
        sym2 = oldsym;
    else sym2 = (t_symbol *)t_getbytes(sizeof(*sym2));
    symname = t_getbytes(length+1);
    sym2->s_next = 0;
    sym2->s_thing = 0;
    strcpy(symname, s);
    sym2->s_name = symname;
    *symhashloc = sym2;
    return (sym2);
}